

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  int iVar1;
  uint *puVar2;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *__x;
  size_type sVar3;
  char *prefixed;
  double *in_RSI;
  double *in_RDI;
  int delta;
  int comp;
  uint min_len;
  char *other_str;
  char *this_str;
  uint other_len;
  uint this_len;
  int typeDelta;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  void *local_38;
  void *local_30;
  uint local_24;
  uint local_20;
  int local_1c;
  bool local_1;
  
  local_1c = (uint)(*(ushort *)(in_RDI + 1) & 0xff) - (uint)(*(ushort *)(in_RSI + 1) & 0xff);
  if (local_1c == 0) {
    prefixed = (char *)(ulong)*(byte *)(in_RDI + 1);
    switch(prefixed) {
    case (char *)0x0:
      local_1 = false;
      break;
    case (char *)0x1:
      local_1 = (long)*in_RDI < (long)*in_RSI;
      break;
    case (char *)0x2:
      local_1 = (ulong)*in_RDI < (ulong)*in_RSI;
      break;
    case (char *)0x3:
      local_1 = *in_RDI < *in_RSI;
      break;
    case (char *)0x4:
      if ((*in_RDI == 0.0) || (*in_RSI == 0.0)) {
        if (*in_RSI == 0.0) {
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
      else {
        decodePrefixedString
                  (SUB81((ulong)in_RDI >> 0x38,0),prefixed,in_stack_ffffffffffffffa0,
                   (char **)in_stack_ffffffffffffff98);
        decodePrefixedString
                  (SUB81((ulong)in_RDI >> 0x38,0),prefixed,in_stack_ffffffffffffffa0,
                   (char **)in_stack_ffffffffffffff98);
        puVar2 = std::min<unsigned_int>(&local_20,&local_24);
        iVar1 = memcmp(local_30,local_38,(ulong)*puVar2);
        if (iVar1 < 0) {
          local_1 = true;
        }
        else if (iVar1 < 1) {
          local_1 = local_20 < local_24;
        }
        else {
          local_1 = false;
        }
      }
      break;
    case (char *)0x5:
      local_1 = (*(byte *)in_RDI & 1) < (*(byte *)in_RSI & 1);
      break;
    case (char *)0x6:
    case (char *)0x7:
      __x = (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
             *)std::
               map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
               ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                       *)0x160337);
      sVar3 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                      *)0x160349);
      if ((int)__x == (int)sVar3) {
        local_1 = std::operator<(__x,in_stack_ffffffffffffff98);
      }
      else {
        local_1 = (int)__x - (int)sVar3 < 0;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_value.cpp"
                    ,0x21e,"bool Json::Value::operator<(const Value &) const");
    }
  }
  else {
    local_1 = (bool)((byte)(local_1c >> 0x1f) & 1);
  }
  return local_1;
}

Assistant:

bool Value::operator<(const Value& other) const {
  int typeDelta = type_ - other.type_;
  if (typeDelta)
    return typeDelta < 0 ? true : false;
  switch (type_) {
  case nullValue:
    return false;
  case intValue:
    return value_.int_ < other.value_.int_;
  case uintValue:
    return value_.uint_ < other.value_.uint_;
  case realValue:
    return value_.real_ < other.value_.real_;
  case booleanValue:
    return value_.bool_ < other.value_.bool_;
  case stringValue:
  {
    if ((value_.string_ == 0) || (other.value_.string_ == 0)) {
      if (other.value_.string_) return true;
      else return false;
    }
    unsigned this_len;
    unsigned other_len;
    char const* this_str;
    char const* other_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    decodePrefixedString(other.allocated_, other.value_.string_, &other_len, &other_str);
    unsigned min_len = std::min(this_len, other_len);
    int comp = memcmp(this_str, other_str, min_len);
    if (comp < 0) return true;
    if (comp > 0) return false;
    return (this_len < other_len);
  }
  case arrayValue:
  case objectValue: {
    int delta = int(value_.map_->size() - other.value_.map_->size());
    if (delta)
      return delta < 0;
    return (*value_.map_) < (*other.value_.map_);
  }
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}